

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O3

bool __thiscall
COLLADABU::Math::Matrix3::toEulerAnglesYZX
          (Matrix3 *this,Real *rfYAngle_radian,Real *rfPAngle_radian,Real *rfRAngle_radian)

{
  double dVar1;
  
  dVar1 = asin(this->m[1][0]);
  *rfPAngle_radian = dVar1;
  if (HALF_PI <= dVar1) {
    dVar1 = atan2(this->m[2][1],this->m[2][2]);
    *rfRAngle_radian = 0.0;
    *rfYAngle_radian = dVar1;
  }
  else {
    if (-HALF_PI < dVar1) {
      dVar1 = atan2(-this->m[2][0],this->m[0][0]);
      *rfYAngle_radian = dVar1;
      dVar1 = atan2(-this->m[1][2],this->m[1][1]);
      *rfRAngle_radian = dVar1;
      return true;
    }
    dVar1 = atan2(this->m[2][1],this->m[2][2]);
    *rfRAngle_radian = 0.0;
    *rfYAngle_radian = 0.0 - dVar1;
  }
  return false;
}

Assistant:

bool Matrix3::toEulerAnglesYZX ( Real& rfYAngle_radian, Real& rfPAngle_radian,
                                         Real& rfRAngle_radian ) const
        {
            // rot =  cy*cz           sx*sy-cx*cy*sz  cx*sy+cy*sx*sz
            //        sz              cx*cz          -cz*sx
            //       -cz*sy           cy*sx+cx*sy*sz  cx*cy-sx*sy*sz

            rfPAngle_radian = asin( m[ 1 ][ 0 ] );

            if ( rfPAngle_radian <  Math::HALF_PI  )
            {
                if ( rfPAngle_radian >  -Math::HALF_PI )
                {
                    rfYAngle_radian = atan2( -m[ 2 ][ 0 ], m[ 0 ][ 0 ] );
                    rfRAngle_radian = atan2( -m[ 1 ][ 2 ], m[ 1 ][ 1 ] );
                    return true;
                }

                else
                {
                    // WARNING.  Not a unique solution.
                    Real fRmY_radian = atan2( m[ 2 ][ 1 ], m[ 2 ][ 2 ] );
                    rfRAngle_radian =  0.0;  // any angle works
                    rfYAngle_radian = rfRAngle_radian - fRmY_radian;
                    return false;
                }
            }

            else
            {
                // WARNING.  Not a unique solution.
                Real fRpY_radian = atan2( m[ 2 ][ 1 ], m[ 2 ][ 2 ] );
                rfRAngle_radian =  0.0;  // any angle works
                rfYAngle_radian = fRpY_radian - rfRAngle_radian;
                return false;
            }
        }